

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O2

void __thiscall bloaty::RangeMap::Compress(RangeMap *this)

{
  __type_conflict _Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator iVar5;
  iterator __position;
  
  p_Var4 = (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5._M_node = p_Var4;
LAB_00184a97:
  __position._M_node = p_Var4;
  do {
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->mappings_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if ((long)&(iVar5._M_node[2]._M_parent)->_M_color + *(long *)(iVar5._M_node + 1) !=
        *(long *)(__position._M_node + 1)) break;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &iVar5._M_node[1]._M_parent,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__position._M_node[1]._M_parent);
    if (!_Var1) {
      if ((iVar5._M_node[1]._M_left != (_Base_ptr)0x0) &&
         ((char)(iVar5._M_node[1]._M_parent)->_M_color == 0x5b)) break;
      bVar2 = Entry::IsShortFallback((Entry *)&__position._M_node[1]._M_parent);
      if (!bVar2) break;
    }
    iVar5._M_node[2]._M_parent =
         (_Base_ptr)
         ((long)&(__position._M_node[2]._M_parent)->_M_color +
         (long)&(iVar5._M_node[2]._M_parent)->_M_color);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                        *)this,__position);
    __position._M_node = p_Var3;
  } while( true );
  p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  iVar5._M_node = __position._M_node;
  goto LAB_00184a97;
}

Assistant:

void RangeMap::Compress() {
  auto prev = mappings_.begin();
  auto it = prev;
  while (it != mappings_.end()) {
    if (prev->first + prev->second.size == it->first &&
        (prev->second.label == it->second.label ||
         (!prev->second.HasFallbackLabel() && it->second.IsShortFallback()))) {
      prev->second.size += it->second.size;
      mappings_.erase(it++);
    } else {
      prev = it;
      ++it;
    }
  }
}